

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strings.c
# Opt level: O0

STRING_HANDLE STRING_new_quoted(char *source)

{
  size_t __n;
  char *pcVar1;
  LOGGER_LOG p_Var2;
  size_t local_38;
  LOGGER_LOG l;
  size_t malloc_size;
  size_t sourceLength;
  STRING *result;
  char *source_local;
  
  if (source == (char *)0x0) {
    sourceLength = 0;
  }
  else {
    sourceLength = (size_t)malloc(8);
    if ((STRING_HANDLE)sourceLength != (STRING_HANDLE)0x0) {
      __n = strlen(source);
      if (__n < 0xfffffffffffffffc) {
        local_38 = __n + 3;
      }
      else {
        local_38 = 0xffffffffffffffff;
      }
      if (local_38 != 0xffffffffffffffff) {
        pcVar1 = (char *)malloc(local_38);
        ((STRING_HANDLE)sourceLength)->s = pcVar1;
        if (pcVar1 != (char *)0x0) {
          *((STRING_HANDLE)sourceLength)->s = '\"';
          memcpy(((STRING_HANDLE)sourceLength)->s + 1,source,__n);
          ((STRING_HANDLE)sourceLength)->s[__n + 1] = '\"';
          ((STRING_HANDLE)sourceLength)->s[__n + 2] = '\0';
          return (STRING_HANDLE)sourceLength;
        }
      }
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/strings.c"
                  ,"STRING_new_quoted",0xf6,1,"Failure allocating quoted string value. size=%zu",
                  local_38);
      }
      free((void *)sourceLength);
      sourceLength = 0;
    }
  }
  return (STRING_HANDLE)sourceLength;
}

Assistant:

STRING_HANDLE STRING_new_quoted(const char* source)
{
    STRING* result;
    if (source == NULL)
    {
        /* Codes_SRS_STRING_07_009: [STRING_new_quoted shall return a NULL STRING_HANDLE if the supplied const char* is NULL.] */
        result = NULL;
    }
    else if ((result = (STRING*)malloc(sizeof(STRING))) != NULL)
    {
        size_t sourceLength = strlen(source);
        size_t malloc_size = safe_add_size_t(sourceLength, 3);
        if (malloc_size != SIZE_MAX && (result->s = (char*)malloc(malloc_size)) != NULL)
        {
            result->s[0] = '"';
            (void)memcpy(result->s + 1, source, sourceLength);
            result->s[sourceLength + 1] = '"';
            result->s[sourceLength + 2] = '\0';
        }
        else
        {
            /* Codes_SRS_STRING_07_031: [STRING_new_quoted shall return a NULL STRING_HANDLE if any error is encountered.] */
            LogError("Failure allocating quoted string value. size=%zu", malloc_size);
            free(result);
            result = NULL;
        }
    }
    return (STRING_HANDLE)result;
}